

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O1

void lvlfill_solid(level *lev,schar filling,schar lit)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  uint *puVar4;
  uint *puVar5;
  long lVar6;
  
  if (1 < x_maze_max) {
    puVar4 = (uint *)&lev->locations[2][0].field_0x6;
    lVar3 = 2;
    do {
      if (-1 < y_maze_max) {
        lVar6 = -1;
        puVar5 = puVar4;
        do {
          if (filling < '\'') {
            *(schar *)((long)puVar5 + -2) = filling;
          }
          if (filling == '\x15') {
            *(byte *)((long)puVar5 + 1) = *(byte *)((long)puVar5 + 1) | 4;
          }
          else if (lit != -2) {
            if (lit == -1) {
              uVar2 = mt_random();
              *puVar5 = *puVar5 & 0xfffffbff | (uVar2 & 1) << 10;
            }
            else {
              *puVar5 = *puVar5 & 0xfffffbff | (uint)(lit & 1) << 10;
            }
          }
          lVar6 = lVar6 + 1;
          puVar5 = puVar5 + 3;
        } while (lVar6 < y_maze_max);
      }
      puVar4 = puVar4 + 0x3f;
      bVar1 = lVar3 < x_maze_max;
      lVar3 = lVar3 + 1;
    } while (bVar1);
  }
  return;
}

Assistant:

static void lvlfill_solid(struct level *lev, schar filling, schar lit)
{
	int x, y;

	for (x = 2; x <= x_maze_max; x++) {
	    for (y = 0; y <= y_maze_max; y++) {
		SET_TYPLIT(lev, x, y, filling, lit);
	    }
	}
}